

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

void __thiscall QSystemLocale::~QSystemLocale(QSystemLocale *this)

{
  QSystemLocale *pQVar1;
  QSystemLocale *pQVar2;
  
  this->_vptr_QSystemLocale = (_func_int **)&PTR__QSystemLocale_0069bed0;
  pQVar1 = _systemLocale;
  if (_systemLocale != this) {
    while (pQVar2 = pQVar1, pQVar2 != (QSystemLocale *)0x0) {
      pQVar1 = pQVar2->next;
      if (pQVar2->next == this) {
        pQVar1 = this->next;
        pQVar2->next = pQVar1;
      }
    }
    return;
  }
  _systemLocale = this->next;
  systemLocaleData.m_language_id = 0;
  return;
}

Assistant:

QSystemLocale::~QSystemLocale()
{
    if (_systemLocale == this) {
        _systemLocale = next;

        // Change to system locale => force refresh.
        systemLocaleData.m_language_id = 0;
    } else {
        for (QSystemLocale *p = _systemLocale; p; p = p->next) {
            if (p->next == this)
                p->next = next;
        }
    }
}